

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O0

UInt32 crnlib::GetOptimumFast(CLzmaEnc *p,UInt32 *backRes)

{
  uint uVar1;
  UInt32 *pUVar2;
  UInt32 UVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  Byte *data2_1;
  uint local_68;
  UInt32 limit;
  UInt32 len_1;
  UInt32 newDistance;
  Byte *data2;
  UInt32 len;
  UInt32 *matches;
  Byte *data;
  uint local_38;
  UInt32 i;
  UInt32 repLen;
  UInt32 repIndex;
  UInt32 numPairs;
  UInt32 mainDist;
  UInt32 mainLen;
  UInt32 numAvail;
  UInt32 *backRes_local;
  CLzmaEnc *p_local;
  
  _mainLen = backRes;
  backRes_local = (UInt32 *)p;
  if (p->additionalOffset == 0) {
    numPairs = ReadMatchDistances(p,&repLen);
  }
  else {
    numPairs = p->longestMatchLength;
    repLen = p->numPairs;
  }
  mainDist = backRes_local[0x134];
  *_mainLen = 0xffffffff;
  if (mainDist < 2) {
    p_local._4_4_ = 1;
  }
  else {
    if (0x111 < mainDist) {
      mainDist = 0x111;
    }
    pcVar4 = (char *)(**(code **)(backRes_local + 6))(*(undefined8 *)(backRes_local + 0xc));
    pUVar2 = backRes_local;
    pcVar5 = pcVar4 + -1;
    i = 0;
    local_38 = 0;
    for (data._4_4_ = 0; data._4_4_ < 4; data._4_4_ = data._4_4_ + 1) {
      pcVar6 = pcVar5 + -(ulong)(backRes_local[(ulong)data._4_4_ + 0xcbdc] + 1);
      if ((*pcVar5 == *pcVar6) && (*pcVar4 == pcVar6[1])) {
        data2._4_4_ = 2;
        while( true ) {
          bVar7 = false;
          if (data2._4_4_ < mainDist) {
            bVar7 = pcVar5[data2._4_4_] == pcVar6[data2._4_4_];
          }
          if (!bVar7) break;
          data2._4_4_ = data2._4_4_ + 1;
        }
        if (backRes_local[0xcbda] <= data2._4_4_) {
          *_mainLen = data._4_4_;
          MovePos((CLzmaEnc *)backRes_local,data2._4_4_ - 1);
          return data2._4_4_;
        }
        if (local_38 < data2._4_4_) {
          i = data._4_4_;
          local_38 = data2._4_4_;
        }
      }
    }
    if (numPairs < backRes_local[0xcbda]) {
      repIndex = 0;
      if (1 < numPairs) {
        repIndex = backRes_local[(ulong)(repLen - 1) + 0xc9b5];
        while( true ) {
          bVar7 = false;
          if (2 < repLen) {
            bVar7 = numPairs == backRes_local[(ulong)(repLen - 4) + 0xc9b5] + 1;
          }
          if ((!bVar7) || (repIndex >> 7 <= backRes_local[(ulong)(repLen - 3) + 0xc9b5])) break;
          numPairs = backRes_local[(ulong)(repLen - 4) + 0xc9b5];
          repIndex = backRes_local[(ulong)(repLen - 3) + 0xc9b5];
          repLen = repLen - 2;
        }
        if ((numPairs == 2) && (0x7f < repIndex)) {
          numPairs = 1;
        }
      }
      if ((local_38 < 2) ||
         (((local_38 + 1 < numPairs && ((local_38 + 2 < numPairs || (repIndex < 0x200)))) &&
          ((local_38 + 3 < numPairs || (repIndex < 0x8000)))))) {
        if ((numPairs < 2) || (mainDist < 3)) {
          p_local._4_4_ = 1;
        }
        else {
          UVar3 = ReadMatchDistances((CLzmaEnc *)backRes_local,backRes_local + 0x133);
          backRes_local[0x132] = UVar3;
          if ((backRes_local[0x132] < 2) ||
             (((((uVar1 = pUVar2[(ulong)(backRes_local[0x133] - 1) + 0xc9b5],
                 backRes_local[0x132] < numPairs || (repIndex <= uVar1)) &&
                ((backRes_local[0x132] != numPairs + 1 || (repIndex < uVar1 >> 7)))) &&
               (backRes_local[0x132] <= numPairs + 1)) &&
              (((backRes_local[0x132] + 1 < numPairs || (numPairs < 3)) || (repIndex >> 7 <= uVar1))
              )))) {
            pcVar4 = (char *)(**(code **)(backRes_local + 6))(*(undefined8 *)(backRes_local + 0xc));
            pcVar5 = pcVar4 + -1;
            for (data._4_4_ = 0; data._4_4_ < 4; data._4_4_ = data._4_4_ + 1) {
              pcVar6 = pcVar5 + -(ulong)(backRes_local[(ulong)data._4_4_ + 0xcbdc] + 1);
              if ((*pcVar5 == *pcVar6) && (*pcVar4 == pcVar6[1])) {
                local_68 = 2;
                while( true ) {
                  bVar7 = false;
                  if (local_68 < numPairs - 1) {
                    bVar7 = pcVar5[local_68] == pcVar6[local_68];
                  }
                  if (!bVar7) break;
                  local_68 = local_68 + 1;
                }
                if (numPairs - 1 <= local_68) {
                  return 1;
                }
              }
            }
            *_mainLen = repIndex + 4;
            MovePos((CLzmaEnc *)backRes_local,numPairs - 2);
            p_local._4_4_ = numPairs;
          }
          else {
            p_local._4_4_ = 1;
          }
        }
      }
      else {
        *_mainLen = i;
        MovePos((CLzmaEnc *)backRes_local,local_38 - 1);
        p_local._4_4_ = local_38;
      }
    }
    else {
      *_mainLen = backRes_local[(ulong)(repLen - 1) + 0xc9b5] + 4;
      MovePos((CLzmaEnc *)backRes_local,numPairs - 1);
      p_local._4_4_ = numPairs;
    }
  }
  return p_local._4_4_;
}

Assistant:

static UInt32 GetOptimumFast(CLzmaEnc* p, UInt32* backRes) {
  UInt32 numAvail, mainLen, mainDist, numPairs, repIndex, repLen, i;
  const Byte* data;
  const UInt32* matches;

  if (p->additionalOffset == 0)
    mainLen = ReadMatchDistances(p, &numPairs);
  else {
    mainLen = p->longestMatchLength;
    numPairs = p->numPairs;
  }

  numAvail = p->numAvail;
  *backRes = (UInt32)-1;
  if (numAvail < 2)
    return 1;
  if (numAvail > LZMA_MATCH_LEN_MAX)
    numAvail = LZMA_MATCH_LEN_MAX;
  data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;

  repLen = repIndex = 0;
  for (i = 0; i < LZMA_NUM_REPS; i++) {
    UInt32 len;
    const Byte* data2 = data - (p->reps[i] + 1);
    if (data[0] != data2[0] || data[1] != data2[1])
      continue;
    for (len = 2; len < numAvail && data[len] == data2[len]; len++)
      ;
    if (len >= p->numFastBytes) {
      *backRes = i;
      MovePos(p, len - 1);
      return len;
    }
    if (len > repLen) {
      repIndex = i;
      repLen = len;
    }
  }

  matches = p->matches;
  if (mainLen >= p->numFastBytes) {
    *backRes = matches[numPairs - 1] + LZMA_NUM_REPS;
    MovePos(p, mainLen - 1);
    return mainLen;
  }

  mainDist = 0; /* for GCC */
  if (mainLen >= 2) {
    mainDist = matches[numPairs - 1];
    while (numPairs > 2 && mainLen == matches[numPairs - 4] + 1) {
      if (!ChangePair(matches[numPairs - 3], mainDist))
        break;
      numPairs -= 2;
      mainLen = matches[numPairs - 2];
      mainDist = matches[numPairs - 1];
    }
    if (mainLen == 2 && mainDist >= 0x80)
      mainLen = 1;
  }

  if (repLen >= 2 && ((repLen + 1 >= mainLen) ||
                      (repLen + 2 >= mainLen && mainDist >= (1 << 9)) ||
                      (repLen + 3 >= mainLen && mainDist >= (1 << 15)))) {
    *backRes = repIndex;
    MovePos(p, repLen - 1);
    return repLen;
  }

  if (mainLen < 2 || numAvail <= 2)
    return 1;

  p->longestMatchLength = ReadMatchDistances(p, &p->numPairs);
  if (p->longestMatchLength >= 2) {
    UInt32 newDistance = matches[p->numPairs - 1];
    if ((p->longestMatchLength >= mainLen && newDistance < mainDist) ||
        (p->longestMatchLength == mainLen + 1 && !ChangePair(mainDist, newDistance)) ||
        (p->longestMatchLength > mainLen + 1) ||
        (p->longestMatchLength + 1 >= mainLen && mainLen >= 3 && ChangePair(newDistance, mainDist)))
      return 1;
  }

  data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - 1;
  for (i = 0; i < LZMA_NUM_REPS; i++) {
    UInt32 len, limit;
    const Byte* data2 = data - (p->reps[i] + 1);
    if (data[0] != data2[0] || data[1] != data2[1])
      continue;
    limit = mainLen - 1;
    for (len = 2; len < limit && data[len] == data2[len]; len++)
      ;
    if (len >= limit)
      return 1;
  }
  *backRes = mainDist + LZMA_NUM_REPS;
  MovePos(p, mainLen - 2);
  return mainLen;
}